

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void write_audio_frame(Emulator *e,u32 gb_frames)

{
  u32 *puVar1;
  uint uVar2;
  uint uVar3;
  
  puVar1 = &(e->audio_buffer).divisor;
  *puVar1 = *puVar1 + gb_frames;
  uVar3 = gb_frames * (e->audio_buffer).frequency + (e->audio_buffer).freq_counter;
  uVar2 = uVar3 - 0x200000;
  if (0x1fffff >= uVar3) {
    uVar2 = uVar3;
  }
  (e->audio_buffer).freq_counter = uVar2;
  if (0x1fffff < uVar3) {
    write_audio_frame_cold_1();
  }
  if ((e->audio_buffer).position <= (e->audio_buffer).end) {
    return;
  }
  __assert_fail("buffer->position <= buffer->end",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
                0xf36,"void write_audio_frame(Emulator *, u32)");
}

Assistant:

static void write_audio_frame(Emulator* e, u32 gb_frames) {
  int i, j;
  AudioBuffer* buffer = &e->audio_buffer;
  buffer->divisor += gb_frames;
  buffer->freq_counter += buffer->frequency * gb_frames;
  if (VALUE_WRAPPED(buffer->freq_counter, APU_TICKS_PER_SECOND)) {
    for (i = 0; i < SOUND_OUTPUT_COUNT; ++i) {
      u32 accumulator = 0;
      for (j = 0; j < APU_CHANNEL_COUNT; ++j) {
        if (!e->config.disable_sound[j]) {
          accumulator += APU.channel[j].accumulator * APU.so_output[j][i];
        }
      }
      accumulator *= (APU.so_volume[i] + 1) * 16; /* 4bit -> 8bit samples. */
      accumulator /= ((SOUND_OUTPUT_MAX_VOLUME + 1) * APU_CHANNEL_COUNT);
      *buffer->position++ = accumulator / buffer->divisor;
    }
    for (j = 0; j < APU_CHANNEL_COUNT; ++j) {
      APU.channel[j].accumulator = 0;
    }
    buffer->divisor = 0;
  }
  assert(buffer->position <= buffer->end);
}